

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

void pystring::os::path::splitext_generic
               (string *root,string *ext,string *p,string *sep,string *altsep,string *extsep)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  string local_a8;
  string local_88;
  string local_68;
  int local_48;
  int local_44;
  int filenameIndex;
  int dotIndex;
  int altsepIndex;
  int sepIndex;
  string *extsep_local;
  string *altsep_local;
  string *sep_local;
  string *p_local;
  string *ext_local;
  string *root_local;
  
  _altsepIndex = extsep;
  extsep_local = altsep;
  altsep_local = sep;
  sep_local = p;
  p_local = ext;
  ext_local = root;
  dotIndex = rfind(p,sep,0,0x7fffffff);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    filenameIndex = rfind(sep_local,extsep_local,0,0x7fffffff);
    piVar4 = std::max<int>(&dotIndex,&filenameIndex);
    dotIndex = *piVar4;
  }
  local_44 = rfind(sep_local,_altsepIndex,0,0x7fffffff);
  iVar1 = dotIndex;
  if (dotIndex < local_44) {
    do {
      local_48 = iVar1 + 1;
      if (local_44 <= local_48) goto LAB_0010f6d3;
      slice(&local_68,sep_local,local_48,0x7fffffff);
      bVar2 = std::operator!=(&local_68,_altsepIndex);
      std::__cxx11::string::~string((string *)&local_68);
      iVar1 = local_48;
    } while (!bVar2);
    slice(&local_88,sep_local,0,local_44);
    std::__cxx11::string::operator=((string *)ext_local,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    slice(&local_a8,sep_local,local_44,0x7fffffff);
    std::__cxx11::string::operator=((string *)p_local,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
LAB_0010f6d3:
    std::__cxx11::string::operator=((string *)ext_local,(string *)sep_local);
    std::__cxx11::string::operator=((string *)p_local,(string *)empty_string_abi_cxx11_);
  }
  return;
}

Assistant:

void splitext_generic(std::string & root, std::string & ext,
                          const std::string & p,
                          const std::string & sep,
                          const std::string & altsep,
                          const std::string & extsep)
    {
        int sepIndex = pystring::rfind(p, sep);
        if(!altsep.empty())
        {
            int altsepIndex = pystring::rfind(p, altsep);
            sepIndex = std::max(sepIndex, altsepIndex);
        }

        int dotIndex = pystring::rfind(p, extsep);
        if(dotIndex > sepIndex)
        {
            // Skip all leading dots
            int filenameIndex = sepIndex + 1;

            while(filenameIndex < dotIndex)
            {
                if(pystring::slice(p,filenameIndex) != extsep)
                {
                    root = pystring::slice(p, 0, dotIndex);
                    ext = pystring::slice(p, dotIndex);
                    return;
                }

                filenameIndex += 1;
            }
        }

        root = p;
        ext = empty_string;
    }